

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode
GetMonitoredItems(void *handle,UA_NodeId objectId,size_t inputSize,UA_Variant *input,
                 size_t outputSize,UA_Variant *output)

{
  uint uVar1;
  UA_StatusCode UVar2;
  UA_Subscription *pUVar3;
  void *pvVar4;
  void *pvVar5;
  UA_MonitoredItem *pUVar6;
  UA_MonitoredItem *pUVar7;
  ulong size;
  
  pUVar3 = UA_Session_getSubscriptionByID(methodCallSession,*input->data);
  if (pUVar3 == (UA_Subscription *)0x0) {
    UVar2 = 0x80280000;
  }
  else {
    pUVar7 = (UA_MonitoredItem *)&pUVar3->monitoredItems;
    uVar1 = 0xffffffff;
    pUVar6 = pUVar7;
    do {
      pUVar6 = (pUVar6->listEntry).le_next;
      uVar1 = uVar1 + 1;
    } while (pUVar6 != (UA_MonitoredItem *)0x0);
    if (uVar1 != 0) {
      size = (ulong)uVar1;
      pvVar4 = UA_Array_new(size,UA_TYPES + 6);
      pvVar5 = UA_Array_new(size,UA_TYPES + 6);
      uVar1 = 0;
      while (pUVar7 = (pUVar7->listEntry).le_next, pUVar7 != (UA_MonitoredItem *)0x0) {
        *(UA_UInt32 *)((long)pvVar4 + (ulong)uVar1 * 4) = pUVar7->clientHandle;
        *(UA_UInt32 *)((long)pvVar5 + (ulong)uVar1 * 4) = pUVar7->itemId;
        uVar1 = uVar1 + 1;
      }
      output->data = (void *)0x0;
      output->arrayDimensionsSize = 0;
      *(undefined8 *)&output->storageType = 0;
      output->arrayLength = 0;
      output->arrayDimensions = (UA_UInt32 *)0x0;
      output->data = pvVar4;
      output->arrayLength = size;
      output->type = (UA_DataType *)0x13b4b0;
      output[1].data = (void *)0x0;
      output[1].arrayDimensionsSize = 0;
      *(undefined8 *)&output[1].storageType = 0;
      output[1].arrayLength = 0;
      output[1].arrayDimensions = (UA_UInt32 *)0x0;
      output[1].data = pvVar5;
      output[1].arrayLength = size;
      output[1].type = (UA_DataType *)0x13b4b0;
    }
    UVar2 = 0;
  }
  return UVar2;
}

Assistant:

static UA_StatusCode
GetMonitoredItems(void *handle, const UA_NodeId objectId, size_t inputSize,
                  const UA_Variant *input, size_t outputSize, UA_Variant *output) {
    UA_UInt32 subscriptionId = *((UA_UInt32*)(input[0].data));
    UA_Session* session = methodCallSession;
    UA_Subscription* subscription = UA_Session_getSubscriptionByID(session, subscriptionId);
    if(!subscription)
        return UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;

    UA_UInt32 sizeOfOutput = 0;
    UA_MonitoredItem* monitoredItem;
    LIST_FOREACH(monitoredItem, &subscription->monitoredItems, listEntry) {
        ++sizeOfOutput;
    }
    if(sizeOfOutput==0)
        return UA_STATUSCODE_GOOD;

    UA_UInt32* clientHandles = UA_Array_new(sizeOfOutput, &UA_TYPES[UA_TYPES_UINT32]);
    UA_UInt32* serverHandles = UA_Array_new(sizeOfOutput, &UA_TYPES[UA_TYPES_UINT32]);
    UA_UInt32 i = 0;
    LIST_FOREACH(monitoredItem, &subscription->monitoredItems, listEntry) {
        clientHandles[i] = monitoredItem->clientHandle;
        serverHandles[i] = monitoredItem->itemId;
        ++i;
    }
    UA_Variant_setArray(&output[0], clientHandles, sizeOfOutput, &UA_TYPES[UA_TYPES_UINT32]);
    UA_Variant_setArray(&output[1], serverHandles, sizeOfOutput, &UA_TYPES[UA_TYPES_UINT32]);
    return UA_STATUSCODE_GOOD;
}